

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O2

void __thiscall TTD::MarkTable::Grow(MarkTable *this)

{
  unsigned_long *obj;
  MarkTableTag *buffer;
  uint32 targetSize;
  int32 iVar1;
  HeapAllocator *pHVar2;
  unsigned_long *puVar3;
  MarkTableTag *pMVar4;
  ulong count;
  uint32 i;
  ulong uVar5;
  undefined1 local_60 [8];
  TrackAllocData data;
  uint32 dummyPowerOf2;
  uint32 dummyNearPrime;
  
  count = (ulong)this->m_capcity;
  obj = this->m_addrArray;
  buffer = this->m_markArray;
  targetSize = this->m_capcity * 2;
  this->m_capcity = targetSize;
  data.line = 0;
  data._36_4_ = 0;
  LoadValuesForHashTables(targetSize,&data.line,(uint32 *)&data.field_0x24,&this->m_h2Prime);
  data.plusSize = (size_t)this->m_capcity;
  local_60 = (undefined1  [8])&unsigned_long::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_3eb50dd;
  data.filename._0_4_ = 0x577;
  pHVar2 = Memory::HeapAllocator::TrackAllocInfo
                     (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_60);
  puVar3 = (unsigned_long *)
           Memory::HeapAllocator::NoThrowAllocZero(pHVar2,(ulong)this->m_capcity << 3);
  puVar3 = TTD_MEM_ALLOC_CHECK<unsigned_long>(puVar3);
  this->m_addrArray = puVar3;
  data.plusSize = (size_t)this->m_capcity;
  local_60 = (undefined1  [8])&MarkTableTag::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_3eb50dd;
  data.filename._0_4_ = 0x578;
  pHVar2 = Memory::HeapAllocator::TrackAllocInfo
                     (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_60);
  pMVar4 = (MarkTableTag *)Memory::HeapAllocator::NoThrowAllocZero(pHVar2,(ulong)this->m_capcity);
  pMVar4 = TTD_MEM_ALLOC_CHECK<TTD::MarkTableTag>(pMVar4);
  this->m_markArray = pMVar4;
  for (uVar5 = 0; count != uVar5; uVar5 = uVar5 + 1) {
    iVar1 = FindIndexForKey(this,obj[uVar5]);
    this->m_addrArray[iVar1] = obj[uVar5];
    this->m_markArray[iVar1] = buffer[uVar5];
  }
  Memory::DeleteArray<Memory::HeapAllocator,unsigned_long>
            (&Memory::HeapAllocator::Instance,count,obj);
  Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,buffer,count);
  return;
}

Assistant:

void Grow()
        {
            uint32 oldCapacity = this->m_capcity;
            uint64* oldAddrArray = this->m_addrArray;
            MarkTableTag* oldMarkArray = this->m_markArray;

            this->m_capcity = this->m_capcity << 1; //double capacity

            uint32 dummyPowerOf2 = 0;
            uint32 dummyNearPrime = 0;
            LoadValuesForHashTables(this->m_capcity, &dummyPowerOf2, &dummyNearPrime, &(this->m_h2Prime));

            this->m_addrArray = TT_HEAP_ALLOC_ARRAY_ZERO(uint64, this->m_capcity);
            this->m_markArray = TT_HEAP_ALLOC_ARRAY_ZERO(MarkTableTag, this->m_capcity);

            for (uint32 i = 0; i < oldCapacity; ++i)
            {
                int32 idx = this->FindIndexForKey(oldAddrArray[i]);
                this->m_addrArray[idx] = oldAddrArray[i];
                this->m_markArray[idx] = oldMarkArray[i];
            }

            TT_HEAP_FREE_ARRAY(uint64, oldAddrArray, oldCapacity);
            TT_HEAP_FREE_ARRAY(MarkTableTag, oldMarkArray, oldCapacity);
        }